

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscreteFactoredStates.cpp
# Opt level: O1

void __thiscall
MultiAgentDecisionProcessDiscreteFactoredStates::Initialize2DBN
          (MultiAgentDecisionProcessDiscreteFactoredStates *this,ScopeFunctor *SetScopes,
          TransitionProbFunctor *ComputeTransitionProb,
          ObservationProbFunctor *ComputeObservationProb)

{
  TwoStageDynamicBayesianNetwork *this_00;
  size_t sVar1;
  pointer pSVar2;
  pointer pSVar3;
  pointer pSVar4;
  pointer puVar5;
  pointer puVar6;
  long lVar7;
  pointer ppCVar8;
  pointer pSVar9;
  void *pvVar10;
  bool bVar11;
  byte bVar12;
  Index IVar13;
  Index IVar14;
  long lVar15;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar16;
  CPT *pCVar17;
  CPT *this_01;
  undefined8 *puVar18;
  CPT *pCVar19;
  ulong uVar20;
  long *plVar21;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double dVar22;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Ys;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Xs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> r_nrY;
  vector<unsigned_long,_std::allocator<unsigned_long>_> r_nrA;
  vector<unsigned_long,_std::allocator<unsigned_long>_> r_nrX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> As;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Ys_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Xs_1;
  allocator_type local_131;
  long *local_130;
  CPT *local_128;
  CPT *local_120;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_118;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_100;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  undefined4 local_9c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  long *local_68;
  ObservationProbFunctor *local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  long local_48;
  long *local_40;
  long local_38;
  
  this_00 = &this->_m_2dbn;
  local_60 = ComputeObservationProb;
  TwoStageDynamicBayesianNetwork::InitializeStorage(this_00);
  (**SetScopes->_vptr_ScopeFunctor)(SetScopes);
  this->_m_connectionsSpecified = true;
  TwoStageDynamicBayesianNetwork::InitializeIIs(this_00);
  local_130 = (long *)(**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xb8))(this);
  lVar15 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xa8))(this);
  if (lVar15 != 0) {
    pCVar19 = (CPT *)0x0;
    dVar22 = extraout_XMM0_Qa;
    do {
      if ((CPT *)(local_130[1] - *local_130 >> 3) <= pCVar19) goto LAB_004859bf;
      sVar1 = *(size_t *)(*local_130 + (long)pCVar19 * 8);
      pSVar2 = (this->_m_2dbn)._m_XSoI_Y.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
               super__Vector_impl_data._M_start;
      pSVar3 = (this->_m_2dbn)._m_ASoI_Y.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
               super__Vector_impl_data._M_start;
      pSVar4 = (this->_m_2dbn)._m_YSoI_Y.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar5 = pSVar2[(long)pCVar19].super_SDT.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      lVar15 = *(long *)&pSVar2[(long)pCVar19].super_SDT.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
      puVar6 = pSVar3[(long)pCVar19].super_SDT.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      lVar7 = *(long *)&pSVar3[(long)pCVar19].super_SDT.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
      local_120 = (CPT *)((long)pSVar4[(long)pCVar19].super_SDT.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         *(long *)&pSVar4[(long)pCVar19].super_SDT.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl);
      IVar14 = (Index)pCVar19;
      pvVar16 = TwoStageDynamicBayesianNetwork::GetNrVals_XSoI_Y(this_00,IVar14);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_b8,pvVar16);
      pvVar16 = TwoStageDynamicBayesianNetwork::GetNrVals_ASoI_Y(this_00,IVar14);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_d0,pvVar16);
      pvVar16 = TwoStageDynamicBayesianNetwork::GetNrVals_YSoI_Y(this_00,IVar14);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_e8,pvVar16);
      pCVar17 = (CPT *)TwoStageDynamicBayesianNetwork::GetiiSize_Y(this_00,IVar14);
      this_01 = (CPT *)operator_new(0x30);
      CPT::CPT(this_01,sVar1,(size_t)pCVar17);
      local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0;
      local_128 = pCVar17;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_100,(long)puVar5 - lVar15 >> 2,(value_type_conflict1 *)&local_98,
                 (allocator_type *)&local_118);
      local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_98,(long)puVar6 - lVar7 >> 2,(value_type_conflict1 *)&local_118,
                 (allocator_type *)&local_80);
      local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_118,(long)local_120 >> 2,(value_type_conflict1 *)&local_80,
                 (allocator_type *)&local_58);
      pCVar17 = (CPT *)0x0;
      do {
        local_120 = pCVar17;
        if (sVar1 != 0) {
          uVar20 = 0;
          do {
            (**ComputeTransitionProb->_vptr_TransitionProbFunctor)
                      (ComputeTransitionProb,pCVar19,uVar20,&local_100,&local_98,
                       (allocator_type *)&local_118);
            if (1e-12 < dVar22) {
              IVar13 = TwoStageDynamicBayesianNetwork::IndividualToJointYiiIndices
                                 (this_00,IVar14,&local_100,&local_98,&local_118);
              (*(this_01->super_CPDDiscreteInterface)._vptr_CPDDiscreteInterface[3])
                        (this_01,uVar20,(ulong)IVar13);
            }
            uVar20 = (ulong)((int)uVar20 + 1);
          } while (uVar20 < sVar1);
        }
        bVar11 = IndexTools::Increment(&local_118,&local_e8);
        pCVar17 = (CPT *)((long)&(local_120->super_CPDDiscreteInterface)._vptr_CPDDiscreteInterface
                         + 1);
      } while (((!bVar11) || (bVar11 = IndexTools::Increment(&local_98,&local_d0), !bVar11)) ||
              (bVar11 = IndexTools::Increment(&local_100,&local_b8), !bVar11));
      if (local_128 != pCVar17) {
        puVar18 = (undefined8 *)__cxa_allocate_exception(0x28);
        *puVar18 = &PTR__E_0059bd80;
        puVar18[1] = puVar18 + 3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(puVar18 + 1),"ii_size != ii_size2 ","");
        __cxa_throw(puVar18,&E::typeinfo,E::~E);
      }
      ppCVar8 = (this->_m_2dbn)._m_Y_CPDs.
                super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((CPT *)((long)(this->_m_2dbn)._m_Y_CPDs.
                        super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar8 >> 3) <= pCVar19)
      {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   pCVar19);
      }
      ppCVar8[(long)pCVar19] = (CPDDiscreteInterface *)this_01;
      pvVar10 = (void *)CONCAT44(local_118.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 local_118.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._0_4_);
      if (pvVar10 != (void *)0x0) {
        operator_delete(pvVar10,(long)local_118.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)pvVar10);
      }
      pvVar10 = (void *)CONCAT44(local_98.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 local_98.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._0_4_);
      if (pvVar10 != (void *)0x0) {
        operator_delete(pvVar10,(long)local_98.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)pvVar10);
      }
      if (local_100.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_100.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_100.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_100.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_e8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_e8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_d0.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_d0.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_b8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pCVar19 = (CPT *)(ulong)(IVar14 + 1);
      pCVar17 = (CPT *)(**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xa8))();
      dVar22 = extraout_XMM0_Qa_00;
    } while (pCVar19 < pCVar17);
  }
  if (local_60->_m_isEmpty == false) {
    local_40 = (long *)(**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x160))(this);
    lVar15 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x10))(this);
    if (lVar15 != 0) {
      pCVar19 = (CPT *)0x0;
      do {
        if ((CPT *)(local_40[1] - *local_40 >> 3) <= pCVar19) {
LAB_004859bf:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     pCVar19);
        }
        sVar1 = *(size_t *)(*local_40 + (long)pCVar19 * 8);
        pSVar2 = (this->_m_2dbn)._m_OSoI_O.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl
                 .super__Vector_impl_data._M_start;
        pSVar3 = (this->_m_2dbn)._m_ASoI_O.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl
                 .super__Vector_impl_data._M_start;
        pSVar4 = (this->_m_2dbn)._m_YSoI_O.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl
                 .super__Vector_impl_data._M_start;
        pSVar9 = (this->_m_2dbn)._m_XSoI_O.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl
                 .super__Vector_impl_data._M_start;
        puVar5 = pSVar2[(long)pCVar19].super_SDT.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        lVar15 = *(long *)&pSVar2[(long)pCVar19].super_SDT.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
        local_130 = (long *)((long)pSVar3[(long)pCVar19].super_SDT.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            *(long *)&pSVar3[(long)pCVar19].super_SDT.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl);
        puVar6 = pSVar4[(long)pCVar19].super_SDT.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        lVar7 = *(long *)&pSVar4[(long)pCVar19].super_SDT.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
        local_38 = (long)pSVar9[(long)pCVar19].super_SDT.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   *(long *)&pSVar9[(long)pCVar19].super_SDT.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
        ;
        bVar11 = local_38 != 0;
        bVar12 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x1d0))(this);
        this->_m_eventObservability = (bool)(bVar12 | bVar11);
        IVar14 = (Index)pCVar19;
        dVar22 = extraout_XMM0_Qa_01;
        pvVar16 = TwoStageDynamicBayesianNetwork::GetNrVals_OSoI_O(this_00,IVar14);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_b8,pvVar16);
        pvVar16 = TwoStageDynamicBayesianNetwork::GetNrVals_ASoI_O(this_00,IVar14);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_d0,pvVar16);
        pvVar16 = TwoStageDynamicBayesianNetwork::GetNrVals_YSoI_O(this_00,IVar14);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_e8,pvVar16);
        pvVar16 = TwoStageDynamicBayesianNetwork::GetNrVals_XSoI_O(this_00,IVar14);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_100,pvVar16);
        local_68 = (long *)TwoStageDynamicBayesianNetwork::GetiiSize_O(this_00,IVar14);
        local_128 = (CPT *)operator_new(0x30);
        CPT::CPT(local_128,sVar1,(size_t)local_68);
        local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_98,(long)puVar5 - lVar15 >> 2,(value_type_conflict1 *)&local_118,
                   (allocator_type *)&local_80);
        local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_118,(long)local_130 >> 2,(value_type_conflict1 *)&local_80,
                   (allocator_type *)&local_58);
        local_58 = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_80,(long)puVar6 - lVar7 >> 2,(value_type_conflict1 *)&local_58,
                   (allocator_type *)&local_9c);
        local_9c = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58,local_38 >> 2,
                   (value_type_conflict1 *)&local_9c,&local_131);
        plVar21 = (long *)0x0;
        local_120 = pCVar19;
        do {
          local_130 = plVar21;
          if (sVar1 != 0) {
            uVar20 = 0;
            do {
              (**local_60->_vptr_ObservationProbFunctor)
                        (local_60,(ulong)pCVar19 & 0xffffffff,uVar20,(allocator_type *)&local_58,
                         &local_118,&local_80,&local_98);
              IVar14 = TwoStageDynamicBayesianNetwork::IndividualToJointOiiIndices
                                 (this_00,(Index)pCVar19,
                                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58,
                                  &local_118,&local_80,&local_98);
              if (1e-12 < dVar22) {
                (*(local_128->super_CPDDiscreteInterface)._vptr_CPDDiscreteInterface[3])
                          (local_128,uVar20,(ulong)IVar14);
              }
              uVar20 = (ulong)((int)uVar20 + 1);
              pCVar19 = local_120;
            } while (uVar20 < sVar1);
          }
          bVar11 = IndexTools::Increment(&local_98,&local_b8);
          plVar21 = (long *)((long)local_130 + 1);
        } while ((((!bVar11) || (bVar11 = IndexTools::Increment(&local_80,&local_e8), !bVar11)) ||
                 ((this->_m_eventObservability == true &&
                  (bVar11 = IndexTools::Increment
                                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                       &local_58,
                                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       &local_100), !bVar11)))) ||
                (bVar11 = IndexTools::Increment(&local_118,&local_d0), !bVar11));
        if (local_68 != plVar21) {
          puVar18 = (undefined8 *)__cxa_allocate_exception(0x28);
          *puVar18 = &PTR__E_0059bd80;
          puVar18[1] = puVar18 + 3;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(puVar18 + 1),"ii_size != ii_size2 ","");
          __cxa_throw(puVar18,&E::typeinfo,E::~E);
        }
        ppCVar8 = (this->_m_2dbn)._m_O_CPDs.
                  super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((CPT *)((long)(this->_m_2dbn)._m_O_CPDs.
                          super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar8 >> 3) <=
            pCVar19) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     pCVar19);
        }
        ppCVar8[(long)pCVar19] = &local_128->super_CPDDiscreteInterface;
        pvVar10 = (void *)CONCAT44(uStack_54,local_58);
        if (pvVar10 != (void *)0x0) {
          operator_delete(pvVar10,local_48 - (long)pvVar10);
        }
        pvVar10 = (void *)CONCAT44(local_80.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,
                                   local_80.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._0_4_);
        if (pvVar10 != (void *)0x0) {
          operator_delete(pvVar10,(long)local_80.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)pvVar10);
        }
        pvVar10 = (void *)CONCAT44(local_118.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,
                                   local_118.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._0_4_);
        if (pvVar10 != (void *)0x0) {
          operator_delete(pvVar10,(long)local_118.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)pvVar10);
        }
        pvVar10 = (void *)CONCAT44(local_98.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,
                                   local_98.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._0_4_);
        if (pvVar10 != (void *)0x0) {
          operator_delete(pvVar10,(long)local_98.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)pvVar10);
        }
        if (local_100.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_100.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_100.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_100.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_e8.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_e8.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_d0.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d0.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_b8.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_b8.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        pCVar19 = (CPT *)(ulong)((int)pCVar19 + 1);
        pCVar17 = (CPT *)(**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x10))();
      } while (pCVar19 < pCVar17);
    }
  }
  SetInitialized(this,true);
  return;
}

Assistant:

void MultiAgentDecisionProcessDiscreteFactoredStates::Initialize2DBN(ScopeFunctor& SetScopes,
                                                                     TransitionProbFunctor& ComputeTransitionProb,
                                                                     ObservationProbFunctor& ComputeObservationProb)
{
//Initialize storage in the 2DBN
    _m_2dbn.InitializeStorage(); 
#if DEBUG_2DBN
    cout << "MultiAgentDecisionProcessDiscreteFactoredStates: 2DBN storage initialized"<<endl;
    cout << _m_2dbn.SoftPrint();
#endif
    SetScopes();
    SetConnectionsSpecified(true);
#if DEBUG_2DBN
    cout << "MultiAgentDecisionProcessDiscreteFactoredStates::scopes set and thus all connections specified"<<endl;
    cout << _m_2dbn.SoftPrint();
#endif

//initialize II meta-information
    _m_2dbn.InitializeIIs();

    const vector<size_t>& nryVals = GetNrValuesPerFactor();
//Create Transition model
#if DEBUG_2DBN
    if(DEBUG_2DBN) cout << ">>>Adding Transition model..."<<endl;
#endif
    //For each state factor, we create the CPT here
    for(Index y=0; y< GetNrStateFactors(); y++)
    {
#if DEBUG_2DBN
        cout << "Creating CPT for sfI=" << GetStateFactorDiscrete(y)->GetName() << endl;
#endif
        //1)determine the SoI(y)
        //2)allocate the CPT
        //3)fill it up
        //4)attach it to 2BDN
        
        //determine the SoI(y)
        size_t nrVals_y = nryVals.at(y);
        const Scope& XSoI_y = _m_2dbn.GetXSoI_Y(y);
        const Scope& ASoI_y = _m_2dbn.GetASoI_Y(y);
        const Scope& YSoI_y = _m_2dbn.GetYSoI_Y(y);
        size_t XSoI_y_size = XSoI_y.size();
        size_t ASoI_y_size = ASoI_y.size();
        size_t YSoI_y_size = YSoI_y.size();
        
        vector<size_t> r_nrX = _m_2dbn.GetNrVals_XSoI_Y(y);
        vector<size_t> r_nrA = _m_2dbn.GetNrVals_ASoI_Y(y);
        vector<size_t> r_nrY = _m_2dbn.GetNrVals_YSoI_Y(y);

        size_t ii_size = _m_2dbn.GetiiSize_Y(y);

        //2)allocate the CPT
        CPT* cpt = new CPT(nrVals_y, ii_size);

        //3)fill it up
        vector<Index> Xs(XSoI_y_size, 0 );
        vector<Index> As(ASoI_y_size, 0 );
        vector<Index> Ys(YSoI_y_size, 0 );
        size_t ii_size2=0;
#if DEBUG_2DBN
        cout << "starting loop through Xs of size " << XSoI_y_size << endl;
#endif
        do{
#if DEBUG_2DBN
          //            cout << SoftPrintVector(Xs) << " - PS state is " <<
          //      SoftPrintPartialState(XSoI_y, Xs) << endl;
#endif
            do{
#if DEBUG_2DBN
                cout << "\ta="<< SoftPrintVector(As) << " (scope="<<
                    ASoI_y <<")" << endl;
#endif
                do{
#if DEBUG_2DBN
                    cout << "\t\t";// << SoftPrintVector(Ys);
#endif
                    ii_size2++;
                    for(Index yVal=0; yVal < nrVals_y; yVal++)
                    {
                        //compute P(y = yVal | ii=<Xs, As, Ys>) :
                        double p = ComputeTransitionProb(y, yVal, Xs,As,Ys);
                        
                        if(p > Globals::PROB_PRECISION)
                        {
#if DEBUG_2DBN
                            cout << "P("<<GetStateFactorDiscrete(y)->GetName()<<":"<<GetStateFactorDiscrete(y)->GetStateFactorValue(yVal)<<"|...)=";
                            printf("%.3f, ", p);
#endif
                            Index iiI = _m_2dbn.IndividualToJointYiiIndices(
                                y, Xs, As, Ys);
                            cpt->Set(yVal, iiI, p);
                        }
                    }
#if DEBUG_2DBN
                    cout << endl;
#endif

                } while(! IndexTools::Increment( Ys, r_nrY ) ); 

            } while(! IndexTools::Increment( As, r_nrA ) ); 

        } while(! IndexTools::Increment( Xs, r_nrX ) ); 
        //cout << "ii_size:" << ii_size << ", ii_size2:" << ii_size2 << endl;
        if (ii_size != ii_size2 )
            throw E("ii_size != ii_size2 ");

        //4)attach it to 2BDN
        _m_2dbn.SetCPD_Y(y, cpt);
    }//end (for y)

    //Only continue if an initialization function for observation probabilities is given
    if(!ComputeObservationProb.isEmpty())
    {
        const vector<size_t>& nroVals = GetNrObservations();
//Create the observation model    
#if DEBUG_2DBN
        cout << ">>>Adding Observation model..."<<endl;
#endif
        //For each observation, we create the CPT here
        for(Index o=0; o < GetNrAgents(); o++)
        {
#if DEBUG_2DBN
            cout << "Creating CPT for oI (i.e., agentI)=" << o << endl;
#endif
            //1)determine the SoI(o)
            //2)allocate the CPT
            //3)fill it up
            //4)attach it to 2BDN
        
            //determine the SoI(o)
            size_t nrVals_o = nroVals.at(o);
            const Scope& OSoI_o = _m_2dbn.GetOSoI_O(o);
            const Scope& ASoI_o = _m_2dbn.GetASoI_O(o);
            const Scope& YSoI_o = _m_2dbn.GetYSoI_O(o);
            const Scope& XSoI_o = _m_2dbn.GetXSoI_O(o);
            size_t OSoI_o_size = OSoI_o.size();
            size_t ASoI_o_size = ASoI_o.size();
            size_t YSoI_o_size = YSoI_o.size();
            size_t XSoI_o_size = XSoI_o.size();
            
            SetEventObservability(GetEventObservability() || XSoI_o_size > 0); //if true, we use O(o,s,a,s') instead of O(o,a,s')
            
            vector<size_t> r_nrO = _m_2dbn.GetNrVals_OSoI_O(o);
            vector<size_t> r_nrA = _m_2dbn.GetNrVals_ASoI_O(o);
            vector<size_t> r_nrY = _m_2dbn.GetNrVals_YSoI_O(o);
            vector<size_t> r_nrX = _m_2dbn.GetNrVals_XSoI_O(o);
            
            size_t ii_size = _m_2dbn.GetiiSize_O(o);
            
            //2)allocate the CPT
            CPT* cpt = new CPT(nrVals_o, ii_size);
            
            //3)fill it up
            vector<Index> Os(OSoI_o_size, 0 );
            vector<Index> As(ASoI_o_size, 0 );
            vector<Index> Ys(YSoI_o_size, 0 );
            vector<Index> Xs(XSoI_o_size, 0 );
            size_t ii_size2=0;
#if DEBUG_2DBN
            cout << "starting loop through Os of size " << OSoI_o_size << endl;
#endif
            do{
                do{
#if DEBUG_2DBN
                    cout << SoftPrintVector(As)<<endl;
#endif
                    do{
                        bool skipY = false;
#if SKIP_IMPOSSIBLE_EVENTS
                        if(_m_eventObservability){
                          for(Index i = 0; i < YSoI_o_size; i++){
                              const Scope& XSoI_y = _m_2dbn.GetXSoI_Y(YSoI_o[i]);
                              const Scope& YSoI_y = _m_2dbn.GetYSoI_Y(YSoI_o[i]);
                              const Scope& ASoI_y = _m_2dbn.GetASoI_Y(YSoI_o[i]);
                              Scope Y;
                              if(XSoI_y.IsSubSetOf(XSoI_o) &&
                                 YSoI_y.IsSubSetOf(YSoI_o) &&
                                 ASoI_y.IsSubSetOf(ASoI_o)){ //I have enough information to know if these transitions are possible
                                Y.Insert(YSoI_o[i]);
                                vector<Index> yVal(1,Ys[YSoI_o[i]]);
                                if(_m_2dbn.GetYProbabilityGeneral(XSoI_o,Xs,
                                                                  ASoI_o,As,
                                                                  YSoI_o,Ys,
                                                                  Y,yVal) <= Globals::PROB_PRECISION){
                                  skipY = true;
                                  break;
                                }                              
                              }
                          }
                        }
#endif
#if DEBUG_2DBN
                  //                    cout << "\t" << SoftPrintVector(Ys) << " - NS state is " <<
                  //        SoftPrintPartialState(YSoI_o, Ys) << endl;
#endif
                        do{
#if DEBUG_2DBN
                          cout << "\t\t";// << SoftPrintVector(Os) //<-empty
#endif
                          ii_size2++;
                          for(Index oVal=0; oVal < nrVals_o; oVal++)
                            {
                              //compute P(o=oVal | ii=<Os, [Xs], As, Ys>) :
                              double p;
                              if(!skipY){
                                p = ComputeObservationProb(o, oVal, Xs, As, Ys, Os);
                              }else{
                                p = 1.0/(float) nrVals_o;
                              }
#if DEBUG_2DBN
                              cout << "P(o="<<oVal<<"|...)=";
                              printf("%.3f, ", p);
#endif
                              Index iiI = _m_2dbn.IndividualToJointOiiIndices(o, Xs, As, Ys, Os);
                              if(p > Globals::PROB_PRECISION)
                                cpt->Set(oVal, iiI, p);
                            }
#if DEBUG_2DBN
                          cout << endl;
#endif
                        } while(! IndexTools::Increment( Os, r_nrO ) ); 
                   
                    } while(! IndexTools::Increment( Ys, r_nrY ) ); 
                
                } while(_m_eventObservability && !IndexTools::Increment( Xs, r_nrX ) ); 
           
            } while(! IndexTools::Increment( As, r_nrA ) ); 
                
            //cout << "ii_size:" << ii_size << ", ii_size2:" << ii_size2 << endl;
            if (ii_size != ii_size2 )
                throw E("ii_size != ii_size2 ");
            
            //4)attach it to 2BDN
            _m_2dbn.SetCPD_O(o, cpt);
        }//end (for o)

    } else {
#if DEBUG_2DBN
        cout << ">>>Skipping addition of Observation model CPTs." << endl;
#endif
    }
    
    SetInitialized(true);
}